

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

void Abc_NtkMiterReport(Abc_Ntk_t *pMiter)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  uint i;
  char *__s;
  
  iVar1 = pMiter->vPos->nSize;
  if (iVar1 == 1) {
    pAVar2 = Abc_NtkPo(pMiter,0);
    pAVar2 = Abc_ObjChild0(pAVar2);
    iVar1 = Abc_AigNodeIsConst(pAVar2);
    pcVar3 = "Unsatisfiable.";
    if (((ulong)pAVar2 & 1) == 0) {
      pcVar3 = "Satisfiable. (Constant 1).";
    }
    __s = "Satisfiable.";
    if (iVar1 != 0) {
      __s = pcVar3;
    }
    puts(__s);
    return;
  }
  for (i = 0; (int)i < iVar1; i = i + 1) {
    Abc_NtkPo(pMiter,i);
    pAVar2 = Abc_NtkPo(pMiter,i);
    pAVar2 = Abc_ObjChild0(pAVar2);
    printf("Output #%2d : ",(ulong)i);
    iVar1 = Abc_AigNodeIsConst(pAVar2);
    pcVar3 = "Unsatisfiable.";
    if (((ulong)pAVar2 & 1) == 0) {
      pcVar3 = "Satisfiable. (Constant 1).";
    }
    if (iVar1 == 0) {
      pcVar3 = "Satisfiable.";
    }
    puts(pcVar3);
    iVar1 = pMiter->vPos->nSize;
  }
  return;
}

Assistant:

void Abc_NtkMiterReport( Abc_Ntk_t * pMiter )
{
    Abc_Obj_t * pChild, * pNode;
    int i;
    if ( Abc_NtkPoNum(pMiter) == 1 )
    {
        pChild = Abc_ObjChild0( Abc_NtkPo(pMiter,0) );
        if ( Abc_AigNodeIsConst(pChild) )
        {
            if ( Abc_ObjIsComplement(pChild) )
                printf( "Unsatisfiable.\n" );
            else
                printf( "Satisfiable. (Constant 1).\n" );
        }
        else
            printf( "Satisfiable.\n" );
    }
    else
    {
        Abc_NtkForEachPo( pMiter, pNode, i )
        {
            pChild = Abc_ObjChild0( Abc_NtkPo(pMiter,i) );
            printf( "Output #%2d : ", i );
            if ( Abc_AigNodeIsConst(pChild) )
            {
                if ( Abc_ObjIsComplement(pChild) )
                    printf( "Unsatisfiable.\n" );
                else
                    printf( "Satisfiable. (Constant 1).\n" );
            }
            else
                printf( "Satisfiable.\n" );
        }
    }
}